

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_assign(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar1;
  JSValue source;
  int iVar2;
  int in_ECX;
  undefined8 in_RDX;
  JSContext *in_RSI;
  long in_R8;
  JSValue JVar3;
  JSValue JVar4;
  int64_t unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  JSValue in_stack_00000050;
  int i;
  JSValue s;
  JSValue obj;
  JSContext *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int64_t local_78;
  int local_5c;
  BOOL setprop;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffff4;
  JSValueUnion in_stack_fffffffffffffff8;
  
  uVar5 = (undefined4)in_RDX;
  setprop = (BOOL)((ulong)in_RDX >> 0x20);
  JVar3.tag._0_4_ = in_stack_fffffffffffffff0;
  JVar3.u = (JSValueUnion)in_RDX;
  JVar3.tag._4_4_ = in_stack_fffffffffffffff4;
  JVar3 = JS_ToObject(in_RSI,JVar3);
  local_78 = JVar3.tag;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    for (local_5c = 1; local_5c < in_ECX; local_5c = local_5c + 1) {
      iVar2 = JS_IsNull(*(JSValue *)(in_R8 + (long)local_5c * 0x10));
      if ((iVar2 == 0) &&
         (iVar2 = JS_IsUndefined(*(JSValue *)(in_R8 + (long)local_5c * 0x10)), iVar2 == 0)) {
        JVar4.u._4_4_ = setprop;
        JVar4.u.int32 = uVar5;
        JVar4.tag._0_4_ = in_stack_fffffffffffffff0;
        JVar4.tag._4_4_ = in_stack_fffffffffffffff4;
        JVar4 = JS_ToObject(in_RSI,JVar4);
        iVar2 = JS_IsException(JVar4);
        if (iVar2 != 0) goto LAB_001aa449;
        in_stack_ffffffffffffff60 = 0;
        in_stack_ffffffffffffff50 = (JSContext *)0x3;
        source.tag = unaff_retaddr;
        source.u.float64 = in_stack_fffffffffffffff8.float64;
        iVar2 = JS_CopyDataProperties
                          ((JSContext *)
                           CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                           (JSValue)in_stack_00000008,source,in_stack_00000050,setprop);
        if (iVar2 != 0) goto LAB_001aa449;
        v.tag._0_4_ = in_stack_ffffffffffffff60;
        v.u.ptr = (void *)in_stack_ffffffffffffff58;
        v.tag._4_4_ = in_stack_ffffffffffffff64;
        JS_FreeValue(in_stack_ffffffffffffff50,v);
      }
    }
    uVar5 = JVar3.u._0_4_;
    in_stack_fffffffffffffff4 = JVar3.u._4_4_;
  }
  else {
LAB_001aa449:
    v_00.tag._0_4_ = in_stack_ffffffffffffff60;
    v_00.u.ptr = (void *)in_stack_ffffffffffffff58;
    v_00.tag._4_4_ = in_stack_ffffffffffffff64;
    JS_FreeValue(in_stack_ffffffffffffff50,v_00);
    v_01.tag._0_4_ = in_stack_ffffffffffffff60;
    v_01.u.ptr = (void *)in_stack_ffffffffffffff58;
    v_01.tag._4_4_ = in_stack_ffffffffffffff64;
    JS_FreeValue(in_stack_ffffffffffffff50,v_01);
    uVar5 = 0;
    local_78 = 6;
  }
  JVar1.u._4_4_ = in_stack_fffffffffffffff4;
  JVar1.u.int32 = uVar5;
  JVar1.tag = local_78;
  return JVar1;
}

Assistant:

static JSValue js_object_assign(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    // Object.assign(obj, source1)
    JSValue obj, s;
    int i;

    s = JS_UNDEFINED;
    obj = JS_ToObject(ctx, argv[0]);
    if (JS_IsException(obj))
        goto exception;
    for (i = 1; i < argc; i++) {
        if (!JS_IsNull(argv[i]) && !JS_IsUndefined(argv[i])) {
            s = JS_ToObject(ctx, argv[i]);
            if (JS_IsException(s))
                goto exception;
            if (JS_CopyDataProperties(ctx, obj, s, JS_UNDEFINED, TRUE))
                goto exception;
            JS_FreeValue(ctx, s);
        }
    }
    return obj;
exception:
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, s);
    return JS_EXCEPTION;
}